

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

ostream * operator<<(ostream *os,cmMakeSafe *self)

{
  char cVar1;
  undefined8 in_RAX;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uStack_28;
  
  pcVar4 = self->Data;
  uStack_28 = in_RAX;
  do {
    cVar1 = *pcVar4;
    if (cVar1 == '=') {
      lVar2 = 9;
      pcVar3 = "$(EQUALS)";
    }
    else {
      if (cVar1 == '\0') {
        return os;
      }
      uStack_28 = CONCAT17(cVar1,(undefined7)uStack_28);
      lVar2 = 1;
      pcVar3 = (char *)((long)&uStack_28 + 7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,lVar2);
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

std::ostream& operator<<(std::ostream& os,
                                  cmMakeSafe const& self)
    {
    for(const char* c = self.Data; *c; ++c)
      {
      switch (*c)
        {
        case '=': os << "$(EQUALS)"; break;
        default: os << *c; break;
        }
      }
    return os;
    }